

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstrumentPass::NewName(InstrumentPass *this,uint32_t id,string *name_str)

{
  string *in_RCX;
  undefined4 in_register_00000034;
  long lVar1;
  initializer_list<unsigned_int> init_list;
  int local_124;
  IRContext *local_120;
  uint local_114 [2];
  Op local_10c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  initializer_list<spvtools::opt::Operand> local_f0;
  SmallVector<unsigned_int,_2UL> local_e0;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_120 = *(IRContext **)(CONCAT44(in_register_00000034,id) + 0x28);
  local_124 = 0;
  local_114[1] = 0;
  local_10c = OpName;
  local_114[0] = (uint)name_str;
  init_list._M_len = 1;
  init_list._M_array = local_114;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
  local_90.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90.words,&local_b8);
  utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,in_RCX);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            (&local_e0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  local_60 = 0xb;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_e0);
  local_f0._M_array = &local_90;
  local_f0._M_len = 2;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,&local_120,&local_10c,&local_124,(int *)(local_114 + 1),&local_f0);
  lVar1 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)((long)(local_90.words.buffer + -6) + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstrumentPass::NewName(
    uint32_t id, const std::string& name_str) {
  return MakeUnique<Instruction>(
      context(), spv::Op::OpName, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {id}},
          {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}});
}